

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86.cpp
# Opt level: O3

int __thiscall
ncnn::Gemm_x86::forward_int8
          (Gemm_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  pointer pMVar1;
  Mat *pMVar2;
  void *pvVar3;
  uint broadcast_type_C;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  float max_kk;
  int iVar8;
  int iVar9;
  int iVar10;
  float fVar11;
  ulong uVar12;
  ulong uVar13;
  Mat *pMVar14;
  Mat *BT;
  float fVar15;
  int *piVar16;
  Gemm_x86 *pGVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  long lVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  uint uVar25;
  int iVar26;
  uint uVar27;
  int iVar28;
  float fVar29;
  size_t sVar30;
  int iVar31;
  int iVar32;
  bool bVar33;
  float B_int8_scale;
  int TILE_K;
  ulong local_320;
  ulong local_318;
  ulong local_310;
  ulong local_308;
  Gemm_x86 *local_300;
  Mat local_2f8;
  Mat m_3;
  Mat m_1;
  Mat m;
  Mat local_1b8;
  Mat local_168;
  Mat m_2;
  float B_int8_scale_1;
  Mat *local_d0;
  int TILE_M;
  int *local_c0;
  size_t local_b8;
  int local_b0;
  Allocator *local_a8;
  int local_a0;
  int local_9c;
  undefined8 local_98;
  int local_90;
  size_t local_88;
  int TILE_K_2;
  int TILE_N;
  int *local_70;
  size_t local_68;
  int local_60;
  Allocator *local_58;
  int local_50;
  int local_4c;
  undefined8 local_48;
  int local_40;
  size_t local_38;
  
  iVar26 = (this->super_Gemm).constantA;
  iVar23 = (this->super_Gemm).constantB;
  if (iVar23 != 0 && iVar26 != 0) {
    uVar20 = (this->super_Gemm).constantM;
LAB_0047eb38:
    uVar25 = (this->super_Gemm).constantN;
  }
  else {
    pMVar1 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (iVar26 == 0) {
      iVar32 = (this->super_Gemm).transA;
      if (iVar23 != 0) {
        if (iVar32 == 0) {
          uVar20 = pMVar1->elempack * (&pMVar1->h)[(ulong)(pMVar1->dims == 3) * 2];
        }
        else {
          uVar20 = pMVar1->w;
        }
        goto LAB_0047eb38;
      }
      if (iVar32 == 0) {
        uVar20 = pMVar1->elempack * (&pMVar1->h)[(ulong)(pMVar1->dims == 3) * 2];
      }
      else {
        uVar20 = pMVar1->w;
      }
      if ((this->super_Gemm).transB == 0) {
        uVar25 = pMVar1[1].w;
      }
      else {
        uVar25 = pMVar1[1].elempack * (&pMVar1[1].h)[(ulong)(pMVar1[1].dims == 3) * 2];
      }
    }
    else {
      uVar20 = (this->super_Gemm).constantM;
      if ((this->super_Gemm).transB == 0) {
        uVar25 = pMVar1->w;
      }
      else {
        uVar25 = pMVar1->elempack * (&pMVar1->h)[(ulong)(pMVar1->dims == 3) * 2];
      }
    }
  }
  local_2f8.dims = 0;
  local_2f8.w = 0;
  local_2f8.h = 0;
  local_2f8.d = 0;
  if ((this->super_Gemm).constantC == 0) {
    pMVar1 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar21 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar1;
    local_300 = this;
    if (iVar23 != 0 && iVar26 != 0) {
      bVar33 = true;
      if (lVar21 == 0x48) {
        local_2f8.data = pMVar1->data;
        piVar16 = pMVar1->refcount;
        sVar30 = pMVar1->elemsize;
        local_2f8.elempack = pMVar1->elempack;
        local_2f8.allocator = pMVar1->allocator;
        local_2f8.dims = pMVar1->dims;
        local_2f8.w = pMVar1->w;
        local_2f8.h = pMVar1->h;
        local_2f8.d = pMVar1->d;
        local_2f8.c = pMVar1->c;
        local_2f8.cstep = pMVar1->cstep;
        if (piVar16 == (int *)0x0) {
          piVar16 = (int *)0x0;
        }
        else {
          LOCK();
          *piVar16 = *piVar16 + 1;
          UNLOCK();
          LOCK();
          *piVar16 = *piVar16 + 1;
          UNLOCK();
          bVar33 = false;
        }
      }
      else {
        local_2f8.allocator = (Allocator *)0x0;
        local_2f8.elempack = 0;
        sVar30 = 0;
        piVar16 = (int *)0x0;
        local_2f8.data = (void *)0x0;
        local_2f8.c = 0;
        local_2f8.cstep = 0;
      }
      local_2f8.refcount._0_4_ = SUB84(piVar16,0);
      local_2f8.refcount._4_4_ = (undefined4)((ulong)piVar16 >> 0x20);
      local_2f8.elemsize._0_4_ = (undefined4)sVar30;
      local_2f8.elemsize._4_4_ = (undefined4)(sVar30 >> 0x20);
      if (!bVar33) {
        LOCK();
        *piVar16 = *piVar16 + -1;
        UNLOCK();
        if (*piVar16 == 0) {
          if (local_2f8.allocator == (Allocator *)0x0) goto LAB_00481688;
          (*(local_2f8.allocator)->_vptr_Allocator[3])(local_2f8.allocator,local_2f8.data);
        }
      }
    }
    else if (iVar26 == 0) {
      if (iVar23 == 0) {
        bVar33 = true;
        if (lVar21 == 0xd8) {
          local_2f8.data = pMVar1[2].data;
          piVar16 = pMVar1[2].refcount;
          sVar30 = pMVar1[2].elemsize;
          local_2f8.elempack = pMVar1[2].elempack;
          local_2f8.allocator = pMVar1[2].allocator;
          local_2f8.dims = pMVar1[2].dims;
          local_2f8.w = pMVar1[2].w;
          local_2f8.h = pMVar1[2].h;
          local_2f8.d = pMVar1[2].d;
          local_2f8.c = pMVar1[2].c;
          local_2f8.cstep = pMVar1[2].cstep;
          if (piVar16 == (int *)0x0) {
            piVar16 = (int *)0x0;
          }
          else {
            LOCK();
            *piVar16 = *piVar16 + 1;
            UNLOCK();
            LOCK();
            *piVar16 = *piVar16 + 1;
            UNLOCK();
            bVar33 = false;
          }
        }
        else {
          local_2f8.cstep = 0;
          local_2f8.c = 0;
          local_2f8.allocator = (Allocator *)0x0;
          local_2f8.elempack = 0;
          sVar30 = 0;
          piVar16 = (int *)0x0;
          local_2f8.data = (void *)0x0;
        }
        local_2f8.refcount._0_4_ = SUB84(piVar16,0);
        local_2f8.refcount._4_4_ = (undefined4)((ulong)piVar16 >> 0x20);
        local_2f8.elemsize._0_4_ = (undefined4)sVar30;
        local_2f8.elemsize._4_4_ = (undefined4)(sVar30 >> 0x20);
        if (!bVar33) {
          LOCK();
          *piVar16 = *piVar16 + -1;
          UNLOCK();
          if (*piVar16 == 0) {
            if (local_2f8.allocator == (Allocator *)0x0) goto LAB_00481688;
            (*(local_2f8.allocator)->_vptr_Allocator[3])(local_2f8.allocator,local_2f8.data);
          }
        }
      }
      else {
        bVar33 = true;
        if (lVar21 == 0x90) {
          local_2f8.data = pMVar1[1].data;
          piVar16 = pMVar1[1].refcount;
          sVar30 = pMVar1[1].elemsize;
          local_2f8.elempack = pMVar1[1].elempack;
          local_2f8.allocator = pMVar1[1].allocator;
          local_2f8.dims = pMVar1[1].dims;
          local_2f8.w = pMVar1[1].w;
          local_2f8.h = pMVar1[1].h;
          local_2f8.d = pMVar1[1].d;
          local_2f8.c = pMVar1[1].c;
          local_2f8.cstep = pMVar1[1].cstep;
          if (piVar16 == (int *)0x0) {
            piVar16 = (int *)0x0;
          }
          else {
            LOCK();
            *piVar16 = *piVar16 + 1;
            UNLOCK();
            LOCK();
            *piVar16 = *piVar16 + 1;
            UNLOCK();
            bVar33 = false;
          }
        }
        else {
          local_2f8.cstep = 0;
          local_2f8.c = 0;
          local_2f8.allocator = (Allocator *)0x0;
          local_2f8.elempack = 0;
          sVar30 = 0;
          piVar16 = (int *)0x0;
          local_2f8.data = (void *)0x0;
        }
        local_2f8.refcount._0_4_ = SUB84(piVar16,0);
        local_2f8.refcount._4_4_ = (undefined4)((ulong)piVar16 >> 0x20);
        local_2f8.elemsize._0_4_ = (undefined4)sVar30;
        local_2f8.elemsize._4_4_ = (undefined4)(sVar30 >> 0x20);
        if (!bVar33) {
          LOCK();
          *piVar16 = *piVar16 + -1;
          UNLOCK();
          if (*piVar16 == 0) {
            if (local_2f8.allocator == (Allocator *)0x0) {
LAB_00481688:
              if (local_2f8.data != (void *)0x0) {
                free(local_2f8.data);
              }
            }
            else {
              (*(local_2f8.allocator)->_vptr_Allocator[3])(local_2f8.allocator,local_2f8.data);
            }
          }
        }
      }
    }
    else {
      bVar33 = true;
      if (lVar21 == 0x90) {
        local_2f8.data = pMVar1[1].data;
        piVar16 = pMVar1[1].refcount;
        sVar30 = pMVar1[1].elemsize;
        local_2f8.elempack = pMVar1[1].elempack;
        local_2f8.allocator = pMVar1[1].allocator;
        local_2f8.dims = pMVar1[1].dims;
        local_2f8.w = pMVar1[1].w;
        local_2f8.h = pMVar1[1].h;
        local_2f8.d = pMVar1[1].d;
        local_2f8.c = pMVar1[1].c;
        local_2f8.cstep = pMVar1[1].cstep;
        if (piVar16 == (int *)0x0) {
          piVar16 = (int *)0x0;
        }
        else {
          LOCK();
          *piVar16 = *piVar16 + 1;
          UNLOCK();
          LOCK();
          *piVar16 = *piVar16 + 1;
          UNLOCK();
          bVar33 = false;
        }
      }
      else {
        local_2f8.cstep = 0;
        local_2f8.c = 0;
        local_2f8.allocator = (Allocator *)0x0;
        local_2f8.elempack = 0;
        sVar30 = 0;
        piVar16 = (int *)0x0;
        local_2f8.data = (void *)0x0;
      }
      local_2f8.refcount._0_4_ = SUB84(piVar16,0);
      local_2f8.refcount._4_4_ = (undefined4)((ulong)piVar16 >> 0x20);
      local_2f8.elemsize._0_4_ = (undefined4)sVar30;
      local_2f8.elemsize._4_4_ = (undefined4)(sVar30 >> 0x20);
      if (!bVar33) {
        LOCK();
        *piVar16 = *piVar16 + -1;
        UNLOCK();
        if (*piVar16 == 0) {
          if (local_2f8.allocator == (Allocator *)0x0) goto LAB_00481688;
          (*(local_2f8.allocator)->_vptr_Allocator[3])(local_2f8.allocator,local_2f8.data);
        }
      }
    }
    pGVar17 = local_300;
    broadcast_type_C = 0;
    if ((local_2f8.data != (void *)0x0) && ((long)local_2f8.c * local_2f8.cstep != 0)) {
      if (local_2f8.dims == 1) {
        broadcast_type_C = 4;
        if (local_2f8.w * local_2f8.elempack != uVar25) {
          broadcast_type_C = (uint)(local_2f8.w * local_2f8.elempack == uVar20);
        }
      }
      else {
        bVar33 = local_2f8.dims == 2;
        broadcast_type_C = 0;
        if (local_2f8.w == 1U && bVar33) {
          broadcast_type_C = (uint)(local_2f8.elempack * local_2f8.h == uVar20) * 2;
        }
        if ((local_2f8.w == 1U && bVar33 || bVar33) && (local_2f8.w == uVar25)) {
          if (local_2f8.elempack * local_2f8.h == uVar20) {
            broadcast_type_C = 3;
          }
          if (local_2f8.elempack * local_2f8.h == 1) {
            broadcast_type_C = 4;
          }
        }
      }
    }
  }
  else {
    piVar16 = (this->CT_data).refcount;
    if (piVar16 != (int *)0x0) {
      LOCK();
      *piVar16 = *piVar16 + 1;
      UNLOCK();
    }
    local_2f8.data = (this->CT_data).data;
    piVar16 = (this->CT_data).refcount;
    local_2f8.refcount._0_4_ = SUB84(piVar16,0);
    local_2f8.refcount._4_4_ = (undefined4)((ulong)piVar16 >> 0x20);
    sVar30 = (this->CT_data).elemsize;
    local_2f8.elemsize._0_4_ = (undefined4)sVar30;
    local_2f8.elemsize._4_4_ = (undefined4)(sVar30 >> 0x20);
    local_2f8.elempack = (this->CT_data).elempack;
    local_2f8.allocator = (this->CT_data).allocator;
    uVar4 = (this->CT_data).dims;
    uVar5 = (this->CT_data).w;
    uVar6 = (this->CT_data).h;
    uVar7 = (this->CT_data).d;
    local_2f8.c = (this->CT_data).c;
    local_2f8.cstep = (this->CT_data).cstep;
    pGVar17 = this;
    local_2f8.dims = uVar4;
    local_2f8.w = uVar5;
    local_2f8.h = uVar6;
    local_2f8.d = uVar7;
    broadcast_type_C = (this->super_Gemm).constant_broadcast_type_C;
  }
  iVar26 = (pGVar17->super_Gemm).output_transpose;
  iVar23 = 1;
  if (opt->use_packing_layout == true) {
    uVar27 = uVar25;
    if (iVar26 == 0) {
      uVar27 = uVar20;
    }
    iVar23 = (uint)((uVar27 & 3) == 0) * 3 + 1;
  }
  iVar32 = (pGVar17->super_Gemm).output_elempack;
  if (iVar32 != 0) {
    iVar23 = iVar32;
  }
  pMVar2 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar27 = uVar25;
  if (iVar26 != 0) {
    uVar27 = uVar20;
    uVar20 = uVar25;
  }
  if ((pGVar17->super_Gemm).output_N1M == 0) {
    Mat::create(pMVar2,uVar27,(int)uVar20 / iVar23,(ulong)(uint)(iVar23 * 4),iVar23,
                opt->blob_allocator);
  }
  else {
    Mat::create(pMVar2,uVar27,1,(int)uVar20 / iVar23,(ulong)(uint)(iVar23 * 4),iVar23,
                opt->blob_allocator);
  }
  iVar26 = -100;
  if ((pMVar2->data == (void *)0x0) || ((long)pMVar2->c * pMVar2->cstep == 0)) goto LAB_0048196b;
  iVar26 = *(int *)&(pGVar17->super_Gemm).field_0x244;
  iVar23 = iVar26;
  if (iVar26 == 0) {
    iVar23 = opt->num_threads;
  }
  if (opt->num_threads != iVar26 && iVar26 != 0) {
    forward_int8();
  }
  iVar26 = (pGVar17->super_Gemm).constantA;
  iVar32 = (pGVar17->super_Gemm).constantB;
  local_d0 = pMVar2;
  if (iVar32 == 0 || iVar26 == 0) {
    pMVar2 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (iVar26 == 0) {
      if (iVar32 == 0) {
        iVar32 = (pGVar17->super_Gemm).transA;
        iVar10 = (pGVar17->super_Gemm).transB;
        if (iVar32 == 0) {
          iVar18 = pMVar2->elempack * (&pMVar2->h)[(ulong)(pMVar2->dims == 3) * 2];
          iVar31 = pMVar2->w;
        }
        else {
          iVar18 = pMVar2->w;
          iVar31 = pMVar2->elempack * (&pMVar2->h)[(ulong)(pMVar2->dims == 3) * 2];
        }
        if (iVar10 == 0) {
          uVar20 = pMVar2[1].w;
        }
        else {
          uVar20 = pMVar2[1].elempack * (&pMVar2[1].h)[(ulong)(pMVar2[1].dims == 3) * 2];
        }
        local_308 = (ulong)(uint)(pGVar17->super_Gemm).output_transpose;
        local_310 = CONCAT44(local_310._4_4_,(pGVar17->super_Gemm).alpha);
        local_318 = CONCAT44(local_318._4_4_,(pGVar17->super_Gemm).beta);
        get_optimal_tile_mnk_int8
                  (iVar18,uVar20,iVar31,(pGVar17->super_Gemm).constant_TILE_M,
                   (pGVar17->super_Gemm).constant_TILE_N,(pGVar17->super_Gemm).constant_TILE_K,
                   &TILE_K,(int *)&B_int8_scale,&TILE_K_2,iVar23);
        iVar24 = (iVar18 + TILE_K + -1) / TILE_K;
        iVar28 = (int)((int)B_int8_scale + uVar20 + -1) / (int)B_int8_scale;
        pGVar17 = (Gemm_x86 *)(ulong)(uint)TILE_K_2;
        iVar19 = (iVar31 + TILE_K_2 + -1) / TILE_K_2;
        local_1b8.cstep = 0;
        local_1b8.data = (Mat *)0x0;
        local_1b8.refcount._0_4_ = 0;
        local_1b8.refcount._4_4_ = 0;
        local_1b8.elemsize._0_4_ = 0;
        local_1b8.elemsize._4_4_ = 0;
        local_1b8.elempack = 0;
        local_1b8.allocator = (Allocator *)0x0;
        local_1b8.dims = 0;
        local_1b8.w = 0;
        local_1b8.h = 0;
        local_1b8.d = 0;
        local_1b8.c = 0;
        local_320 = (ulong)uVar20;
        if (TILE_K_2 < 4) {
LAB_004803ef:
          Mat::create(&local_1b8,TILE_K_2 * TILE_K,iVar19,iVar23,1,opt->workspace_allocator);
        }
        else {
          iVar26 = cpu_support_x86_avx512_vnni();
          bVar33 = true;
          if (iVar26 == 0) {
            iVar26 = cpu_support_x86_avx_vnni();
            bVar33 = iVar26 != 0;
          }
          iVar26 = cpu_support_x86_avx_vnni_int8();
          if (!(bool)(bVar33 & iVar26 == 0)) goto LAB_004803ef;
          iVar26 = 0x40;
          if (((TILE_K < 0x10) && (iVar26 = 0x20, TILE_K < 8)) && (iVar26 = 0x10, TILE_K < 4)) {
            iVar26 = (uint)(1 < TILE_K) * 4 + 4;
          }
          Mat::create(&local_1b8,(iVar26 + TILE_K_2) * TILE_K,iVar19,iVar23,1,
                      opt->workspace_allocator);
        }
        iVar26 = -100;
        if (((Mat *)local_1b8.data != (Mat *)0x0) && ((long)local_1b8.c * local_1b8.cstep != 0)) {
          local_168.cstep = 0;
          local_168.data = (Mat *)0x0;
          local_168.refcount._0_4_ = 0;
          local_168.refcount._4_4_ = 0;
          local_168.elemsize._0_4_ = 0;
          local_168.elemsize._4_4_ = 0;
          local_168.elempack = 0;
          local_168.allocator = (Allocator *)0x0;
          local_168.dims = 0;
          local_168.w = 0;
          local_168.h = 0;
          local_168.d = 0;
          local_168.c = 0;
          Mat::create(&local_168,TILE_K_2 * (int)B_int8_scale,iVar19,iVar28,1,
                      opt->workspace_allocator);
          iVar26 = -100;
          if (((Mat *)local_168.data != (Mat *)0x0) && ((long)local_168.c * local_168.cstep != 0)) {
            m_3.cstep = 0;
            m_3.data = (void *)0x0;
            m_3.refcount._0_4_ = 0;
            m_3.refcount._4_4_ = 0;
            m_3.elemsize._0_4_ = 0;
            m_3.elemsize._4_4_ = 0;
            m_3.elempack = 0;
            m_3.allocator = (Allocator *)0x0;
            m_3.dims = 0;
            m_3.w = 0;
            m_3.h = 0;
            m_3.d = 0;
            m_3.c = 0;
            Mat::create(&m_3,iVar18,4,opt->workspace_allocator);
            iVar26 = -100;
            if ((m_3.data != (void *)0x0) && ((long)m_3.c * m_3.cstep != 0)) {
              pMVar14 = pMVar2 + 1;
              compute_B_int8_scale(pMVar14,&B_int8_scale_1);
              m.cstep = 0;
              m.data = (void *)0x0;
              m.refcount._0_4_ = 0;
              m.refcount._4_4_ = 0;
              m.elemsize._0_4_ = 0;
              m.elemsize._4_4_ = 0;
              m.elempack = 0;
              m.allocator = (Allocator *)0x0;
              m.dims = 0;
              m.w = 0;
              m.h = 0;
              m.d = 0;
              m.c = 0;
              Mat::create(&m,iVar18,4,opt->workspace_allocator);
              fVar15 = B_int8_scale_1;
              iVar26 = -100;
              if ((m.data != (void *)0x0) && ((long)m.c * m.cstep != 0)) {
                iVar28 = iVar19 * iVar28;
                if (0 < iVar28) {
                  iVar26 = 0;
                  do {
                    iVar18 = (iVar26 / iVar19) * (int)B_int8_scale;
                    iVar8 = (int)((long)iVar26 % (long)iVar19) * TILE_K_2;
                    fVar11 = (float)((int)local_320 - iVar18);
                    if ((int)B_int8_scale < (int)fVar11) {
                      fVar11 = B_int8_scale;
                    }
                    iVar22 = iVar31 - iVar8;
                    if (TILE_K_2 < iVar31 - iVar8) {
                      iVar22 = TILE_K_2;
                    }
                    BT = (Mat *)((long)(void **)local_168.data +
                                ((long)iVar26 % (long)iVar19 & 0xffffffffU) * (long)local_168.w *
                                CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize) +
                                (long)(iVar26 / iVar19) * local_168.cstep *
                                CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize));
                    if (iVar10 == 0) {
                      transpose_pack_B_tile_quantize
                                (pMVar14,BT,iVar18,(int)fVar11,iVar8,iVar22,fVar15);
                    }
                    else {
                      pack_B_tile_quantize(pMVar14,BT,iVar18,(int)fVar11,iVar8,iVar22,fVar15);
                    }
                    iVar26 = iVar26 + 1;
                  } while (iVar28 != iVar26);
                }
                m_1.cstep = 0;
                m_1.data = (void *)0x0;
                m_1.refcount._0_4_ = 0;
                m_1.refcount._4_4_ = 0;
                m_1.elemsize._0_4_ = 0;
                m_1.elemsize._4_4_ = 0;
                m_1.elempack = 0;
                m_1.allocator = (Allocator *)0x0;
                m_1.dims = 0;
                m_1.w = 0;
                m_1.h = 0;
                m_1.d = 0;
                m_1.c = 0;
                Mat::create(&m_1,(int)B_int8_scale * TILE_K,1,iVar23,4,opt->workspace_allocator);
                iVar26 = -100;
                if ((m_1.data != (void *)0x0) && ((long)m_1.c * m_1.cstep != 0)) {
                  if (0 < iVar24) {
                    iVar26 = 0;
                    uVar13 = local_320;
                    local_300 = pGVar17;
                    do {
                      if (iVar32 == 0) {
                        iVar23 = pMVar2->elempack * (&pMVar2->h)[(ulong)(pMVar2->dims == 3) * 2];
                        iVar10 = pMVar2->w;
                      }
                      else {
                        iVar23 = pMVar2->w;
                        iVar10 = pMVar2->elempack * (&pMVar2->h)[(ulong)(pMVar2->dims == 3) * 2];
                      }
                      iVar31 = iVar26 * TILE_K;
                      iVar18 = iVar23 - iVar31;
                      if (TILE_K < iVar23 - iVar31) {
                        iVar18 = TILE_K;
                      }
                      iVar23 = get_omp_thread_num();
                      m_2.elemsize = CONCAT44(m_1.elemsize._4_4_,(undefined4)m_1.elemsize);
                      m_2.data = (void *)((long)iVar23 * m_1.cstep * m_2.elemsize + (long)m_1.data);
                      m_2.refcount = (int *)0x0;
                      m_2.elempack = m_1.elempack;
                      m_2.allocator = m_1.allocator;
                      m_2.w = m_1.w;
                      m_2.d = 1;
                      m_2.h = m_1.h;
                      m_2.c = m_1.d;
                      m_2.dims = m_1.dims + -1;
                      m_2.cstep = (m_2.elemsize * (long)m_1.h * (long)m_1.w + 0xf &
                                  0xfffffffffffffff0) / m_2.elemsize;
                      if (m_1.dims == 4) {
                        m_2.cstep = (long)m_1.h * (long)m_1.w;
                      }
                      if (0 < (int)uVar13) {
                        iVar23 = 0;
                        do {
                          fVar15 = (float)((int)uVar13 - iVar23);
                          if ((int)B_int8_scale < (int)fVar15) {
                            fVar15 = B_int8_scale;
                          }
                          if (0 < iVar10) {
                            iVar19 = 0;
                            iVar28 = iVar10;
                            do {
                              iVar22 = (int)pGVar17;
                              iVar8 = iVar28;
                              if (iVar22 < iVar28) {
                                iVar8 = iVar22;
                              }
                              iVar9 = get_omp_thread_num();
                              local_88 = (size_t)local_1b8.w;
                              local_b8 = CONCAT44(local_1b8.elemsize._4_4_,
                                                  (undefined4)local_1b8.elemsize);
                              _TILE_M = (Mat *)((long)(void **)local_1b8.data +
                                               local_b8 * local_88 * (long)(iVar19 / iVar22) +
                                               (long)iVar9 * local_1b8.cstep * local_b8);
                              local_38 = (size_t)local_168.w;
                              local_68 = CONCAT44(local_168.elemsize._4_4_,
                                                  (undefined4)local_168.elemsize);
                              _TILE_N = (void *)((long)(void **)local_168.data +
                                                local_38 * local_68 * (long)(iVar19 / iVar22) +
                                                (long)(iVar23 / (int)B_int8_scale) * local_168.cstep
                                                * local_68);
                              local_c0 = (int *)0x0;
                              local_b0 = local_1b8.elempack;
                              local_a8 = local_1b8.allocator;
                              local_a0 = 2;
                              local_9c = local_1b8.w;
                              local_98._0_4_ = 1;
                              local_98._4_4_ = 1;
                              local_90 = 1;
                              local_70 = (int *)0x0;
                              local_60 = local_168.elempack;
                              local_58 = local_168.allocator;
                              local_50 = 2;
                              local_4c = local_168.w;
                              local_48._0_4_ = 1;
                              local_48._4_4_ = 1;
                              local_40 = 1;
                              if (iVar23 == 0) {
                                if (iVar19 == 0) {
                                  if (iVar32 != 0) {
                                    transpose_compute_A_tile_int8_scales
                                              (pMVar2,(Mat *)m_3.data,B_int8_scale_1,(Mat *)m.data,
                                               iVar31,iVar18);
                                    goto LAB_00480a37;
                                  }
                                  compute_A_tile_int8_scales
                                            (pMVar2,(Mat *)m_3.data,B_int8_scale_1,(Mat *)m.data,
                                             iVar31,iVar18);
                                }
                                else if (iVar32 != 0) {
LAB_00480a37:
                                  transpose_pack_A_tile_quantize
                                            (pMVar2,_TILE_M,iVar31,iVar18,iVar19,iVar8,&m_3);
                                  goto LAB_00480aa9;
                                }
                                pack_A_tile_quantize(pMVar2,_TILE_M,iVar31,iVar18,iVar19,iVar8,&m_3)
                                ;
                              }
LAB_00480aa9:
                              gemm_transB_packed_tile_int8
                                        ((Mat *)&TILE_M,(Mat *)&TILE_N,&m_2,iVar31,iVar18,iVar23,
                                         (int)fVar15,iVar19,iVar8);
                              pGVar17 = local_300;
                              if (local_70 != (int *)0x0) {
                                LOCK();
                                *local_70 = *local_70 + -1;
                                UNLOCK();
                                if (*local_70 == 0) {
                                  if (local_58 == (Allocator *)0x0) {
                                    if (_TILE_N != (void *)0x0) {
                                      free(_TILE_N);
                                    }
                                  }
                                  else {
                                    (*local_58->_vptr_Allocator[3])();
                                  }
                                }
                              }
                              if (local_c0 != (int *)0x0) {
                                LOCK();
                                *local_c0 = *local_c0 + -1;
                                UNLOCK();
                                if (*local_c0 == 0) {
                                  if (local_a8 == (Allocator *)0x0) {
                                    if (_TILE_M != (Mat *)0x0) {
                                      free(_TILE_M);
                                    }
                                  }
                                  else {
                                    (*local_a8->_vptr_Allocator[3])();
                                  }
                                }
                              }
                              iVar19 = iVar19 + (int)pGVar17;
                              iVar28 = iVar28 - (int)pGVar17;
                            } while (iVar19 < iVar10);
                          }
                          unpack_output_tile_dequantize
                                    ((Mat *)m_2.data,&local_2f8,local_d0,broadcast_type_C,iVar31,
                                     iVar18,iVar23,(int)fVar15,&m,(float)local_310,(float)local_318,
                                     (int)local_308);
                          uVar13 = local_320;
                          iVar23 = iVar23 + (int)B_int8_scale;
                        } while (iVar23 < (int)local_320);
                        if (m_2.refcount != (int *)0x0) {
                          LOCK();
                          *m_2.refcount = *m_2.refcount + -1;
                          UNLOCK();
                          if (*m_2.refcount == 0) {
                            if (m_2.allocator == (Allocator *)0x0) {
                              if (m_2.data != (void *)0x0) {
                                free(m_2.data);
                              }
                            }
                            else {
                              (*(m_2.allocator)->_vptr_Allocator[3])();
                            }
                          }
                        }
                      }
                      iVar26 = iVar26 + 1;
                    } while (iVar26 != iVar24);
                  }
                  iVar26 = 0;
                }
                piVar16 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                if (piVar16 != (int *)0x0) {
                  LOCK();
                  *piVar16 = *piVar16 + -1;
                  UNLOCK();
                  if (*piVar16 == 0) {
                    if (m_1.allocator == (Allocator *)0x0) {
                      if (m_1.data != (void *)0x0) {
                        free(m_1.data);
                      }
                    }
                    else {
                      (*(m_1.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
              }
              piVar16 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
              if (piVar16 != (int *)0x0) {
                LOCK();
                *piVar16 = *piVar16 + -1;
                UNLOCK();
                if (*piVar16 == 0) {
                  if (m.allocator == (Allocator *)0x0) {
                    if (m.data != (void *)0x0) {
                      free(m.data);
                    }
                  }
                  else {
                    (*(m.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
            }
            piVar16 = (int *)CONCAT44(m_3.refcount._4_4_,m_3.refcount._0_4_);
            if (piVar16 != (int *)0x0) {
              LOCK();
              *piVar16 = *piVar16 + -1;
              UNLOCK();
              if (*piVar16 == 0) {
                if (m_3.allocator == (Allocator *)0x0) {
                  if (m_3.data != (void *)0x0) {
                    free(m_3.data);
                  }
                }
                else {
                  (*(m_3.allocator)->_vptr_Allocator[3])();
                }
              }
            }
          }
          piVar16 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
          if (piVar16 != (int *)0x0) {
            LOCK();
            *piVar16 = *piVar16 + -1;
            UNLOCK();
            if (*piVar16 == 0) {
              if (local_168.allocator == (Allocator *)0x0) {
                if ((Mat *)local_168.data != (Mat *)0x0) {
                  free(local_168.data);
                }
              }
              else {
                (*(local_168.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        piVar16 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
        if (piVar16 == (int *)0x0) goto LAB_0048196b;
        LOCK();
        *piVar16 = *piVar16 + -1;
        UNLOCK();
        if (*piVar16 != 0) goto LAB_0048196b;
        if (local_1b8.allocator != (Allocator *)0x0) {
          (*(local_1b8.allocator)->_vptr_Allocator[3])();
          goto LAB_0048196b;
        }
      }
      else {
        iVar26 = (pGVar17->super_Gemm).constantN;
        iVar32 = (pGVar17->super_Gemm).constantK;
        iVar10 = (pGVar17->super_Gemm).transA;
        if (iVar10 == 0) {
          iVar18 = pMVar2->elempack * (&pMVar2->h)[(ulong)(pMVar2->dims == 3) * 2];
        }
        else {
          iVar18 = pMVar2->w;
        }
        local_320 = CONCAT44(local_320._4_4_,(pGVar17->super_Gemm).B_data_int8_scale);
        local_310 = (ulong)(uint)(pGVar17->super_Gemm).output_transpose;
        local_318 = CONCAT44(local_318._4_4_,(pGVar17->super_Gemm).alpha);
        fVar15 = (pGVar17->super_Gemm).beta;
        local_308 = CONCAT44(local_308._4_4_,iVar26);
        get_optimal_tile_mnk_int8
                  (iVar18,iVar26,iVar32,(pGVar17->super_Gemm).constant_TILE_M,
                   (pGVar17->super_Gemm).constant_TILE_N,(pGVar17->super_Gemm).constant_TILE_K,
                   &TILE_N,&TILE_K,(int *)&B_int8_scale,iVar23);
        iVar31 = TILE_N;
        iVar24 = (iVar18 + TILE_N + -1) / TILE_N;
        local_1b8.cstep = 0;
        local_1b8.data = (Mat *)0x0;
        local_1b8.refcount._0_4_ = 0;
        local_1b8.refcount._4_4_ = 0;
        local_1b8.elemsize._0_4_ = 0;
        local_1b8.elemsize._4_4_ = 0;
        local_1b8.elempack = 0;
        local_1b8.allocator = (Allocator *)0x0;
        local_1b8.dims = 0;
        local_1b8.w = 0;
        local_1b8.h = 0;
        local_1b8.d = 0;
        local_1b8.c = 0;
        Mat::create(&local_1b8,iVar18,4,opt->workspace_allocator);
        iVar26 = -100;
        if (((Mat *)local_1b8.data != (Mat *)0x0) && ((long)local_1b8.c * local_1b8.cstep != 0)) {
          local_168.cstep = 0;
          local_168.data = (Mat *)0x0;
          local_168.refcount._0_4_ = 0;
          local_168.refcount._4_4_ = 0;
          local_168.elemsize._0_4_ = 0;
          local_168.elemsize._4_4_ = 0;
          local_168.elempack = 0;
          local_168.allocator = (Allocator *)0x0;
          local_168.dims = 0;
          local_168.w = 0;
          local_168.h = 0;
          local_168.d = 0;
          local_168.c = 0;
          Mat::create(&local_168,iVar18,4,opt->workspace_allocator);
          iVar26 = -100;
          if (((Mat *)local_168.data != (Mat *)0x0) && ((long)local_168.c * local_168.cstep != 0)) {
            m_3.cstep = 0;
            m_3.data = (void *)0x0;
            m_3.refcount._0_4_ = 0;
            m_3.refcount._4_4_ = 0;
            m_3.elemsize._0_4_ = 0;
            m_3.elemsize._4_4_ = 0;
            m_3.elempack = 0;
            m_3.allocator = (Allocator *)0x0;
            m_3.dims = 0;
            m_3.w = 0;
            m_3.h = 0;
            m_3.d = 0;
            m_3.c = 0;
            if ((int)B_int8_scale < 4) {
LAB_00480d86:
              Mat::create(&m_3,(int)B_int8_scale * iVar31,
                          (iVar32 + (int)B_int8_scale + -1) / (int)B_int8_scale,iVar23,1,
                          opt->workspace_allocator);
            }
            else {
              iVar26 = cpu_support_x86_avx512_vnni();
              bVar33 = true;
              if (iVar26 == 0) {
                iVar26 = cpu_support_x86_avx_vnni();
                bVar33 = iVar26 != 0;
              }
              iVar26 = cpu_support_x86_avx_vnni_int8();
              if (!(bool)(bVar33 & iVar26 == 0)) goto LAB_00480d86;
              iVar26 = 0x40;
              if (((iVar31 < 0x10) && (iVar26 = 0x20, iVar31 < 8)) && (iVar26 = 0x10, iVar31 < 4)) {
                iVar26 = (uint)(1 < iVar31) * 4 + 4;
              }
              Mat::create(&m_3,(iVar26 + (int)B_int8_scale) * iVar31,
                          (iVar32 + (int)B_int8_scale + -1) / (int)B_int8_scale,iVar23,1,
                          opt->workspace_allocator);
            }
            iVar26 = -100;
            if ((m_3.data != (void *)0x0) && ((long)m_3.c * m_3.cstep != 0)) {
              m.cstep = 0;
              m.data = (void *)0x0;
              m.refcount._0_4_ = 0;
              m.refcount._4_4_ = 0;
              m.elemsize._0_4_ = 0;
              m.elemsize._4_4_ = 0;
              m.elempack = 0;
              m.allocator = (Allocator *)0x0;
              m.dims = 0;
              m.w = 0;
              m.h = 0;
              m.d = 0;
              m.c = 0;
              Mat::create(&m,TILE_K * iVar31,1,iVar23,4,opt->workspace_allocator);
              iVar26 = -100;
              local_300 = pGVar17;
              if ((m.data != (void *)0x0) && ((long)m.c * m.cstep != 0)) {
                if (0 < iVar24) {
                  iVar26 = 0;
                  do {
                    if (iVar10 == 0) {
                      iVar23 = pMVar2->elempack * (&pMVar2->h)[(ulong)(pMVar2->dims == 3) * 2];
                      fVar11 = (float)pMVar2->w;
                    }
                    else {
                      iVar23 = pMVar2->w;
                      fVar11 = (float)(pMVar2->elempack *
                                      (&pMVar2->h)[(ulong)(pMVar2->dims == 3) * 2]);
                    }
                    iVar18 = iVar26 * iVar31;
                    iVar32 = iVar23 - iVar18;
                    if (iVar31 < iVar23 - iVar18) {
                      iVar32 = iVar31;
                    }
                    iVar23 = get_omp_thread_num();
                    uVar13 = CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize);
                    m_1.data = (void *)((long)iVar23 * m.cstep * uVar13 + (long)m.data);
                    m_1.refcount._0_4_ = 0;
                    m_1.refcount._4_4_ = 0;
                    m_1.elemsize._0_4_ = (undefined4)m.elemsize;
                    m_1.elemsize._4_4_ = m.elemsize._4_4_;
                    m_1.elempack = m.elempack;
                    m_1.allocator = m.allocator;
                    m_1.w = m.w;
                    m_1.h = m.h;
                    m_1.d = 1;
                    m_1.c = m.d;
                    m_1.dims = m.dims + -1;
                    m_1.cstep = (uVar13 * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / uVar13
                    ;
                    if (m.dims == 4) {
                      m_1.cstep = (long)m.h * (long)m.w;
                    }
                    if (0 < (int)(float)local_308) {
                      iVar23 = 0;
                      do {
                        iVar28 = (int)(float)local_308 - iVar23;
                        if (TILE_K < (int)(float)local_308 - iVar23) {
                          iVar28 = TILE_K;
                        }
                        if (0 < (int)fVar11) {
                          iVar19 = 0;
                          fVar29 = fVar11;
                          do {
                            max_kk = fVar29;
                            if ((int)B_int8_scale < (int)fVar29) {
                              max_kk = B_int8_scale;
                            }
                            iVar8 = get_omp_thread_num();
                            m_2.cstep = (size_t)m_3.w;
                            m_2.elemsize = CONCAT44(m_3.elemsize._4_4_,(undefined4)m_3.elemsize);
                            m_2.data = (void *)((long)m_3.data +
                                               m_2.elemsize * m_2.cstep *
                                               (long)(iVar19 / (int)B_int8_scale) +
                                               (long)iVar8 * m_3.cstep * m_2.elemsize);
                            m_2.refcount = (int *)0x0;
                            m_2.elempack = m_3.elempack;
                            m_2.allocator = m_3.allocator;
                            m_2.dims = 2;
                            m_2.w = m_3.w;
                            m_2.h = 1;
                            m_2.d = 1;
                            m_2.c = 1;
                            local_9c = (local_300->BT_data).w;
                            local_88 = (size_t)local_9c;
                            local_b8 = (local_300->BT_data).elemsize;
                            _TILE_M = (Mat *)((long)(local_300->BT_data).data +
                                             local_88 * local_b8 *
                                             (long)(iVar19 / (int)B_int8_scale) +
                                             (long)(iVar23 / TILE_K) * (local_300->BT_data).cstep *
                                             local_b8);
                            local_b0 = (local_300->BT_data).elempack;
                            local_a8 = (local_300->BT_data).allocator;
                            local_c0 = (int *)0x0;
                            local_a0 = 2;
                            local_98._0_4_ = 1;
                            local_98._4_4_ = 1;
                            local_90 = 1;
                            if (iVar23 == 0) {
                              if (iVar19 == 0) {
                                if (iVar10 != 0) {
                                  transpose_compute_A_tile_int8_scales
                                            (pMVar2,(Mat *)local_1b8.data,(float)local_320,
                                             (Mat *)local_168.data,iVar18,iVar32);
                                  goto LAB_004811a4;
                                }
                                compute_A_tile_int8_scales
                                          (pMVar2,(Mat *)local_1b8.data,(float)local_320,
                                           (Mat *)local_168.data,iVar18,iVar32);
                              }
                              else if (iVar10 != 0) {
LAB_004811a4:
                                transpose_pack_A_tile_quantize
                                          (pMVar2,(Mat *)m_2.data,iVar18,iVar32,iVar19,(int)max_kk,
                                           &local_1b8);
                                goto LAB_0048120f;
                              }
                              pack_A_tile_quantize
                                        (pMVar2,(Mat *)m_2.data,iVar18,iVar32,iVar19,(int)max_kk,
                                         &local_1b8);
                            }
LAB_0048120f:
                            gemm_transB_packed_tile_int8
                                      (&m_2,(Mat *)&TILE_M,&m_1,iVar18,iVar32,iVar23,iVar28,iVar19,
                                       (int)max_kk);
                            if (local_c0 != (int *)0x0) {
                              LOCK();
                              *local_c0 = *local_c0 + -1;
                              UNLOCK();
                              if (*local_c0 == 0) {
                                if (local_a8 == (Allocator *)0x0) {
                                  if (_TILE_M != (Mat *)0x0) {
                                    free(_TILE_M);
                                  }
                                }
                                else {
                                  (*local_a8->_vptr_Allocator[3])();
                                }
                              }
                            }
                            if (m_2.refcount != (int *)0x0) {
                              LOCK();
                              *m_2.refcount = *m_2.refcount + -1;
                              UNLOCK();
                              if (*m_2.refcount == 0) {
                                if (m_2.allocator == (Allocator *)0x0) {
                                  if (m_2.data != (void *)0x0) {
                                    free(m_2.data);
                                  }
                                }
                                else {
                                  (*(m_2.allocator)->_vptr_Allocator[3])();
                                }
                              }
                            }
                            iVar19 = iVar19 + (int)B_int8_scale;
                            fVar29 = (float)((int)fVar29 - (int)B_int8_scale);
                          } while (iVar19 < (int)fVar11);
                        }
                        unpack_output_tile_dequantize
                                  ((Mat *)m_1.data,&local_2f8,local_d0,broadcast_type_C,iVar18,
                                   iVar32,iVar23,iVar28,&local_168,(float)local_318,fVar15,
                                   (int)local_310);
                        iVar23 = iVar23 + TILE_K;
                      } while (iVar23 < (int)(float)local_308);
                      piVar16 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                      if (piVar16 != (int *)0x0) {
                        LOCK();
                        *piVar16 = *piVar16 + -1;
                        UNLOCK();
                        if (*piVar16 == 0) {
                          if (m_1.allocator == (Allocator *)0x0) {
                            if (m_1.data != (void *)0x0) {
                              free(m_1.data);
                            }
                          }
                          else {
                            (*(m_1.allocator)->_vptr_Allocator[3])();
                          }
                        }
                      }
                    }
                    iVar26 = iVar26 + 1;
                  } while (iVar26 != iVar24);
                }
                iVar26 = 0;
              }
              piVar16 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
              if (piVar16 != (int *)0x0) {
                LOCK();
                *piVar16 = *piVar16 + -1;
                UNLOCK();
                if (*piVar16 == 0) {
                  if (m.allocator == (Allocator *)0x0) {
                    if (m.data != (void *)0x0) {
                      free(m.data);
                    }
                  }
                  else {
                    (*(m.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
            }
            piVar16 = (int *)CONCAT44(m_3.refcount._4_4_,m_3.refcount._0_4_);
            if (piVar16 != (int *)0x0) {
              LOCK();
              *piVar16 = *piVar16 + -1;
              UNLOCK();
              if (*piVar16 == 0) {
                if (m_3.allocator == (Allocator *)0x0) {
                  if (m_3.data != (void *)0x0) {
                    free(m_3.data);
                  }
                }
                else {
                  (*(m_3.allocator)->_vptr_Allocator[3])();
                }
              }
            }
          }
          piVar16 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
          if (piVar16 != (int *)0x0) {
            LOCK();
            *piVar16 = *piVar16 + -1;
            UNLOCK();
            if (*piVar16 == 0) {
              if (local_168.allocator == (Allocator *)0x0) {
                if ((Mat *)local_168.data != (Mat *)0x0) {
                  free(local_168.data);
                }
              }
              else {
                (*(local_168.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        piVar16 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
        if (piVar16 == (int *)0x0) goto LAB_0048196b;
        LOCK();
        *piVar16 = *piVar16 + -1;
        UNLOCK();
        if (*piVar16 != 0) goto LAB_0048196b;
        if (local_1b8.allocator != (Allocator *)0x0) {
          (*(local_1b8.allocator)->_vptr_Allocator[3])();
          goto LAB_0048196b;
        }
      }
    }
    else {
      uVar20 = (pGVar17->super_Gemm).constantM;
      iVar32 = (pGVar17->super_Gemm).constantK;
      iVar10 = (pGVar17->super_Gemm).transB;
      if (iVar10 == 0) {
        iVar18 = pMVar2->w;
      }
      else {
        iVar18 = pMVar2->elempack * (&pMVar2->h)[(ulong)(pMVar2->dims == 3) * 2];
      }
      local_320 = (ulong)(uint)(pGVar17->super_Gemm).output_transpose;
      local_308 = CONCAT44(local_308._4_4_,(pGVar17->super_Gemm).alpha);
      local_310 = CONCAT44(local_310._4_4_,(pGVar17->super_Gemm).beta);
      get_optimal_tile_mnk_int8
                (uVar20,iVar18,iVar32,(pGVar17->super_Gemm).constant_TILE_M,
                 (pGVar17->super_Gemm).constant_TILE_N,(pGVar17->super_Gemm).constant_TILE_K,&TILE_M
                 ,&TILE_N,&TILE_K,iVar23);
      local_318 = (ulong)_TILE_M & 0xffffffff;
      uVar25 = (int)(uVar20 + TILE_M + -1) / TILE_M;
      iVar31 = TILE_N;
      iVar24 = (TILE_N + iVar18 + -1) / TILE_N;
      iVar28 = (iVar32 + TILE_K + -1) / TILE_K;
      local_1b8.cstep = 0;
      local_1b8.data = (Mat *)0x0;
      local_1b8.refcount._0_4_ = 0;
      local_1b8.refcount._4_4_ = 0;
      local_1b8.elemsize._0_4_ = 0;
      local_1b8.elemsize._4_4_ = 0;
      local_1b8.elempack = 0;
      local_1b8.allocator = (Allocator *)0x0;
      local_1b8.dims = 0;
      local_1b8.w = 0;
      local_1b8.h = 0;
      local_1b8.d = 0;
      local_1b8.c = 0;
      Mat::create(&local_1b8,TILE_K * TILE_N,iVar28,iVar24,1,opt->workspace_allocator);
      iVar26 = -100;
      if (((Mat *)local_1b8.data != (Mat *)0x0) && ((long)local_1b8.c * local_1b8.cstep != 0)) {
        compute_B_int8_scale(pMVar2,&B_int8_scale);
        local_168.cstep = 0;
        local_168.data = (Mat *)0x0;
        local_168.refcount._0_4_ = 0;
        local_168.refcount._4_4_ = 0;
        local_168.elemsize._0_4_ = 0;
        local_168.elemsize._4_4_ = 0;
        local_168.elempack = 0;
        local_168.allocator = (Allocator *)0x0;
        local_168.dims = 0;
        local_168.w = 0;
        local_168.h = 0;
        local_168.d = 0;
        local_168.c = 0;
        Mat::create(&local_168,uVar20,4,opt->workspace_allocator);
        iVar26 = -100;
        if (((Mat *)local_168.data != (Mat *)0x0) && ((long)local_168.c * local_168.cstep != 0)) {
          iVar24 = iVar24 * iVar28;
          if (0 < (int)uVar20) {
            pvVar3 = (pGVar17->super_Gemm).A_data_int8_scales.data;
            uVar13 = 0;
            do {
              *(float *)((long)(void **)local_168.data + uVar13 * 4) =
                   1.0 / (*(float *)((long)pvVar3 + uVar13 * 4) * B_int8_scale);
              uVar13 = uVar13 + 1;
            } while (uVar20 != uVar13);
          }
          if (0 < iVar24) {
            iVar26 = 0;
            do {
              iVar8 = (iVar26 / iVar28) * iVar31;
              iVar22 = (int)((long)iVar26 % (long)iVar28) * TILE_K;
              iVar19 = iVar18 - iVar8;
              if (iVar31 < iVar18 - iVar8) {
                iVar19 = iVar31;
              }
              iVar9 = iVar32 - iVar22;
              if (TILE_K < iVar32 - iVar22) {
                iVar9 = TILE_K;
              }
              pMVar14 = (Mat *)((long)(void **)local_1b8.data +
                               ((long)iVar26 % (long)iVar28 & 0xffffffffU) * (long)local_1b8.w *
                               CONCAT44(local_1b8.elemsize._4_4_,(undefined4)local_1b8.elemsize) +
                               (long)(iVar26 / iVar28) * local_1b8.cstep *
                               CONCAT44(local_1b8.elemsize._4_4_,(undefined4)local_1b8.elemsize));
              if (iVar10 == 0) {
                transpose_pack_B_tile_quantize
                          (pMVar2,pMVar14,iVar8,iVar19,iVar22,iVar9,B_int8_scale);
              }
              else {
                pack_B_tile_quantize(pMVar2,pMVar14,iVar8,iVar19,iVar22,iVar9,B_int8_scale);
              }
              iVar26 = iVar26 + 1;
            } while (iVar24 != iVar26);
          }
          m_3.cstep = 0;
          m_3.data = (void *)0x0;
          m_3.refcount._0_4_ = 0;
          m_3.refcount._4_4_ = 0;
          m_3.elemsize._0_4_ = 0;
          m_3.elemsize._4_4_ = 0;
          m_3.elempack = 0;
          m_3.allocator = (Allocator *)0x0;
          m_3.dims = 0;
          m_3.w = 0;
          m_3.h = 0;
          m_3.d = 0;
          m_3.c = 0;
          Mat::create(&m_3,iVar31 * (int)(float)local_318,1,iVar23,4,opt->workspace_allocator);
          iVar26 = -100;
          if ((m_3.data != (void *)0x0) && ((long)m_3.c * m_3.cstep != 0)) {
            if (0 < (int)uVar25) {
              uVar13 = 0;
              do {
                iVar23 = (int)local_318;
                iVar10 = iVar23 * (int)uVar13;
                iVar26 = uVar20 - iVar10;
                if (iVar23 < (int)(uVar20 - iVar10)) {
                  iVar26 = iVar23;
                }
                iVar23 = get_omp_thread_num();
                uVar12 = CONCAT44(m_3.elemsize._4_4_,(undefined4)m_3.elemsize);
                m.data = (void *)((long)iVar23 * m_3.cstep * uVar12 + (long)m_3.data);
                m.refcount._0_4_ = 0;
                m.refcount._4_4_ = 0;
                m.elemsize._0_4_ = (undefined4)m_3.elemsize;
                m.elemsize._4_4_ = m_3.elemsize._4_4_;
                m.elempack = m_3.elempack;
                m.allocator = m_3.allocator;
                m.w = m_3.w;
                m.h = m_3.h;
                m.d = 1;
                m.c = m_3.d;
                m.dims = m_3.dims + -1;
                m.cstep = (uVar12 * (long)m_3.h * (long)m_3.w + 0xf & 0xfffffffffffffff0) / uVar12;
                if (m_3.dims == 4) {
                  m.cstep = (long)m_3.h * (long)m_3.w;
                }
                if (0 < iVar18) {
                  iVar23 = 0;
                  do {
                    iVar24 = iVar18 - iVar23;
                    if (iVar31 < iVar18 - iVar23) {
                      iVar24 = iVar31;
                    }
                    if (0 < iVar32) {
                      iVar19 = 0;
                      iVar28 = iVar32;
                      do {
                        iVar8 = iVar28;
                        if (TILE_K < iVar28) {
                          iVar8 = TILE_K;
                        }
                        m_1.w = (pGVar17->AT_data).w;
                        m_1.cstep = (size_t)m_1.w;
                        sVar30 = (pGVar17->AT_data).elemsize;
                        m_1.elempack = (pGVar17->AT_data).elempack;
                        m_1.allocator = (pGVar17->AT_data).allocator;
                        m_1.data = (void *)((long)(pGVar17->AT_data).data +
                                           sVar30 * m_1.cstep * (long)(iVar19 / TILE_K) +
                                           (pGVar17->AT_data).cstep * uVar13 * sVar30);
                        m_1.refcount._0_4_ = 0;
                        m_1.refcount._4_4_ = 0;
                        m_1.elemsize._0_4_ = (undefined4)sVar30;
                        m_1.elemsize._4_4_ = (undefined4)(sVar30 >> 0x20);
                        m_1.dims = 2;
                        m_1.h = 1;
                        m_1.d = 1;
                        m_1.c = 1;
                        m_2.cstep = (size_t)local_1b8.w;
                        m_2.elemsize = CONCAT44(local_1b8.elemsize._4_4_,
                                                (undefined4)local_1b8.elemsize);
                        m_2.data = (void *)((long)(void **)local_1b8.data +
                                           m_2.cstep * m_2.elemsize * (long)(iVar19 / TILE_K) +
                                           local_1b8.cstep * (long)(iVar23 / iVar31) * m_2.elemsize)
                        ;
                        m_2.refcount = (int *)0x0;
                        m_2.elempack = local_1b8.elempack;
                        m_2.allocator = local_1b8.allocator;
                        m_2.dims = 2;
                        m_2.w = local_1b8.w;
                        m_2.h = 1;
                        m_2.d = 1;
                        m_2.c = 1;
                        gemm_transB_packed_tile_int8
                                  (&m_1,&m_2,&m,iVar10,iVar26,iVar23,iVar24,iVar19,iVar8);
                        if (m_2.refcount != (int *)0x0) {
                          LOCK();
                          *m_2.refcount = *m_2.refcount + -1;
                          UNLOCK();
                          if (*m_2.refcount == 0) {
                            if (m_2.allocator == (Allocator *)0x0) {
                              if (m_2.data != (void *)0x0) {
                                free(m_2.data);
                              }
                            }
                            else {
                              (*(m_2.allocator)->_vptr_Allocator[3])();
                            }
                          }
                        }
                        piVar16 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                        if (piVar16 != (int *)0x0) {
                          LOCK();
                          *piVar16 = *piVar16 + -1;
                          UNLOCK();
                          if (*piVar16 == 0) {
                            if (m_1.allocator == (Allocator *)0x0) {
                              if (m_1.data != (void *)0x0) {
                                free(m_1.data);
                              }
                            }
                            else {
                              (*(m_1.allocator)->_vptr_Allocator[3])();
                            }
                          }
                        }
                        iVar19 = iVar19 + TILE_K;
                        iVar28 = iVar28 - TILE_K;
                      } while (iVar19 < iVar32);
                    }
                    unpack_output_tile_dequantize
                              ((Mat *)m.data,&local_2f8,local_d0,broadcast_type_C,iVar10,iVar26,
                               iVar23,iVar24,&local_168,(float)local_308,(float)local_310,
                               (int)local_320);
                    iVar23 = iVar23 + iVar31;
                  } while (iVar23 < iVar18);
                  piVar16 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
                  if (piVar16 != (int *)0x0) {
                    LOCK();
                    *piVar16 = *piVar16 + -1;
                    UNLOCK();
                    if (*piVar16 == 0) {
                      if (m.allocator == (Allocator *)0x0) {
                        if (m.data != (void *)0x0) {
                          free(m.data);
                        }
                      }
                      else {
                        (*(m.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                }
                uVar13 = uVar13 + 1;
              } while (uVar13 != uVar25);
            }
            iVar26 = 0;
          }
          piVar16 = (int *)CONCAT44(m_3.refcount._4_4_,m_3.refcount._0_4_);
          if (piVar16 != (int *)0x0) {
            LOCK();
            *piVar16 = *piVar16 + -1;
            UNLOCK();
            if (*piVar16 == 0) {
              if (m_3.allocator == (Allocator *)0x0) {
                if (m_3.data != (void *)0x0) {
                  free(m_3.data);
                }
              }
              else {
                (*(m_3.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        piVar16 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
        if (piVar16 != (int *)0x0) {
          LOCK();
          *piVar16 = *piVar16 + -1;
          UNLOCK();
          if (*piVar16 == 0) {
            if (local_168.allocator == (Allocator *)0x0) {
              if ((Mat *)local_168.data != (Mat *)0x0) {
                free(local_168.data);
              }
            }
            else {
              (*(local_168.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      piVar16 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
      if (piVar16 == (int *)0x0) goto LAB_0048196b;
      LOCK();
      *piVar16 = *piVar16 + -1;
      UNLOCK();
      if (*piVar16 != 0) goto LAB_0048196b;
      if (local_1b8.allocator != (Allocator *)0x0) {
        (*(local_1b8.allocator)->_vptr_Allocator[3])();
        goto LAB_0048196b;
      }
    }
  }
  else {
    fVar15 = (pGVar17->super_Gemm).B_data_int8_scale;
    uVar20 = (pGVar17->super_Gemm).constantM;
    iVar32 = (pGVar17->super_Gemm).constantN;
    iVar10 = (pGVar17->super_Gemm).constantK;
    iVar18 = (pGVar17->super_Gemm).output_transpose;
    local_320 = CONCAT44(local_320._4_4_,(pGVar17->super_Gemm).alpha);
    local_308 = CONCAT44(local_308._4_4_,(pGVar17->super_Gemm).beta);
    get_optimal_tile_mnk_int8
              (uVar20,iVar32,iVar10,(pGVar17->super_Gemm).constant_TILE_M,
               (pGVar17->super_Gemm).constant_TILE_N,(pGVar17->super_Gemm).constant_TILE_K,
               (int *)&m_2,&TILE_M,&TILE_N,iVar23);
    local_310 = (ulong)m_2.data & 0xffffffff;
    uVar13 = (long)(int)(uVar20 + (int)m_2.data + -1) / (long)(int)m_2.data;
    local_1b8.cstep = 0;
    local_1b8.data = (Mat *)0x0;
    local_1b8.refcount._0_4_ = 0;
    local_1b8.refcount._4_4_ = 0;
    local_1b8.elemsize._0_4_ = 0;
    local_1b8.elemsize._4_4_ = 0;
    local_1b8.elempack = 0;
    local_1b8.allocator = (Allocator *)0x0;
    local_1b8.dims = 0;
    local_1b8.w = 0;
    local_1b8.h = 0;
    local_1b8.d = 0;
    local_1b8.c = 0;
    Mat::create(&local_1b8,uVar20,4,opt->workspace_allocator);
    iVar26 = -100;
    if (((Mat *)local_1b8.data != (Mat *)0x0) && ((long)local_1b8.c * local_1b8.cstep != 0)) {
      if (0 < (int)uVar20) {
        pvVar3 = (pGVar17->super_Gemm).A_data_int8_scales.data;
        uVar12 = 0;
        do {
          *(float *)((long)(void **)local_1b8.data + uVar12 * 4) =
               1.0 / (*(float *)((long)pvVar3 + uVar12 * 4) * fVar15);
          uVar12 = uVar12 + 1;
        } while (uVar20 != uVar12);
      }
      iVar31 = TILE_M;
      local_168.cstep = 0;
      local_168.data = (Mat *)0x0;
      local_168.refcount._0_4_ = 0;
      local_168.refcount._4_4_ = 0;
      local_168.elemsize._0_4_ = 0;
      local_168.elemsize._4_4_ = 0;
      local_168.elempack = 0;
      local_168.allocator = (Allocator *)0x0;
      local_168.dims = 0;
      local_168.w = 0;
      local_168.h = 0;
      local_168.d = 0;
      local_168.c = 0;
      Mat::create(&local_168,TILE_M * (int)(float)local_310,1,iVar23,4,opt->workspace_allocator);
      iVar26 = -100;
      if (((Mat *)local_168.data != (Mat *)0x0) && ((long)local_168.c * local_168.cstep != 0)) {
        if (0 < (int)uVar13) {
          iVar26 = TILE_N;
          uVar12 = 0;
          local_318 = uVar13 & 0xffffffff;
          local_300 = pGVar17;
          do {
            iVar24 = (int)local_310;
            iVar28 = iVar24 * (int)uVar12;
            iVar23 = uVar20 - iVar28;
            if (iVar24 < (int)(uVar20 - iVar28)) {
              iVar23 = iVar24;
            }
            iVar24 = get_omp_thread_num();
            uVar13 = CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize);
            m_3.data = (void *)((long)(void **)local_168.data +
                               (long)iVar24 * local_168.cstep * uVar13);
            m_3.refcount._0_4_ = 0;
            m_3.refcount._4_4_ = 0;
            m_3.elemsize._0_4_ = (undefined4)local_168.elemsize;
            m_3.elemsize._4_4_ = local_168.elemsize._4_4_;
            m_3.elempack = local_168.elempack;
            m_3.allocator = local_168.allocator;
            m_3.w = local_168.w;
            m_3.h = local_168.h;
            m_3.c = local_168.d;
            m_3.d = 1;
            m_3.dims = local_168.dims + -1;
            m_3.cstep = (uVar13 * (long)local_168.h * (long)local_168.w + 0xf & 0xfffffffffffffff0)
                        / uVar13;
            if (local_168.dims == 4) {
              m_3.cstep = (long)local_168.h * (long)local_168.w;
            }
            if (0 < iVar32) {
              iVar24 = 0;
              do {
                iVar19 = iVar32 - iVar24;
                if (iVar31 < iVar32 - iVar24) {
                  iVar19 = iVar31;
                }
                if (0 < iVar10) {
                  iVar22 = 0;
                  iVar8 = iVar10;
                  do {
                    iVar9 = iVar8;
                    if (iVar26 < iVar8) {
                      iVar9 = iVar26;
                    }
                    m.w = (local_300->AT_data).w;
                    m.cstep = (size_t)m.w;
                    sVar30 = (local_300->AT_data).elemsize;
                    m.elempack = (local_300->AT_data).elempack;
                    m.allocator = (local_300->AT_data).allocator;
                    m.data = (void *)((long)(local_300->AT_data).data +
                                     sVar30 * m.cstep * (long)(iVar22 / iVar26) +
                                     (local_300->AT_data).cstep * uVar12 * sVar30);
                    m.refcount._0_4_ = 0;
                    m.refcount._4_4_ = 0;
                    m.elemsize._0_4_ = (undefined4)sVar30;
                    m.elemsize._4_4_ = (undefined4)(sVar30 >> 0x20);
                    m.dims = 2;
                    m.h = 1;
                    m.d = 1;
                    m.c = 1;
                    m_1.w = (local_300->BT_data).w;
                    m_1.cstep = (size_t)m_1.w;
                    sVar30 = (local_300->BT_data).elemsize;
                    m_1.elempack = (local_300->BT_data).elempack;
                    m_1.data = (void *)((long)(local_300->BT_data).data +
                                       m_1.cstep * sVar30 * (long)(iVar22 / iVar26) +
                                       (local_300->BT_data).cstep * (long)(iVar24 / iVar31) * sVar30
                                       );
                    m_1.allocator = (local_300->BT_data).allocator;
                    m_1.refcount._0_4_ = 0;
                    m_1.refcount._4_4_ = 0;
                    m_1.elemsize._0_4_ = (undefined4)sVar30;
                    m_1.elemsize._4_4_ = (undefined4)(sVar30 >> 0x20);
                    m_1.dims = 2;
                    m_1.h = 1;
                    m_1.d = 1;
                    m_1.c = 1;
                    gemm_transB_packed_tile_int8
                              (&m,&m_1,&m_3,iVar28,iVar23,iVar24,iVar19,iVar22,iVar9);
                    piVar16 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                    if (piVar16 != (int *)0x0) {
                      LOCK();
                      *piVar16 = *piVar16 + -1;
                      UNLOCK();
                      if (*piVar16 == 0) {
                        if (m_1.allocator == (Allocator *)0x0) {
                          if (m_1.data != (void *)0x0) {
                            free(m_1.data);
                          }
                        }
                        else {
                          (*(m_1.allocator)->_vptr_Allocator[3])();
                        }
                      }
                    }
                    piVar16 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
                    if (piVar16 != (int *)0x0) {
                      LOCK();
                      *piVar16 = *piVar16 + -1;
                      UNLOCK();
                      if (*piVar16 == 0) {
                        if (m.allocator == (Allocator *)0x0) {
                          if (m.data != (void *)0x0) {
                            free(m.data);
                          }
                        }
                        else {
                          (*(m.allocator)->_vptr_Allocator[3])();
                        }
                      }
                    }
                    iVar22 = iVar22 + iVar26;
                    iVar8 = iVar8 - iVar26;
                  } while (iVar22 < iVar10);
                }
                unpack_output_tile_dequantize
                          ((Mat *)m_3.data,&local_2f8,local_d0,broadcast_type_C,iVar28,iVar23,iVar24
                           ,iVar19,&local_1b8,(float)local_320,(float)local_308,iVar18);
                iVar24 = iVar24 + iVar31;
              } while (iVar24 < iVar32);
              piVar16 = (int *)CONCAT44(m_3.refcount._4_4_,m_3.refcount._0_4_);
              if (piVar16 != (int *)0x0) {
                LOCK();
                *piVar16 = *piVar16 + -1;
                UNLOCK();
                if (*piVar16 == 0) {
                  if (m_3.allocator == (Allocator *)0x0) {
                    if (m_3.data != (void *)0x0) {
                      free(m_3.data);
                    }
                  }
                  else {
                    (*(m_3.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 != local_318);
        }
        iVar26 = 0;
      }
      piVar16 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
      if (piVar16 != (int *)0x0) {
        LOCK();
        *piVar16 = *piVar16 + -1;
        UNLOCK();
        if (*piVar16 == 0) {
          if (local_168.allocator == (Allocator *)0x0) {
            if ((Mat *)local_168.data != (Mat *)0x0) {
              free(local_168.data);
            }
          }
          else {
            (*(local_168.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    piVar16 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
    if (piVar16 == (int *)0x0) goto LAB_0048196b;
    LOCK();
    *piVar16 = *piVar16 + -1;
    UNLOCK();
    if (*piVar16 != 0) goto LAB_0048196b;
    if (local_1b8.allocator != (Allocator *)0x0) {
      (*(local_1b8.allocator)->_vptr_Allocator[3])();
      goto LAB_0048196b;
    }
  }
  if ((Mat *)local_1b8.data != (Mat *)0x0) {
    free(local_1b8.data);
  }
LAB_0048196b:
  piVar16 = (int *)CONCAT44(local_2f8.refcount._4_4_,local_2f8.refcount._0_4_);
  if (piVar16 != (int *)0x0) {
    LOCK();
    *piVar16 = *piVar16 + -1;
    UNLOCK();
    if (*piVar16 == 0) {
      if (local_2f8.allocator == (Allocator *)0x0) {
        if (local_2f8.data != (void *)0x0) {
          free(local_2f8.data);
        }
      }
      else {
        (*(local_2f8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar26;
}

Assistant:

int Gemm_x86::forward_int8(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    int M;
    int N;
    if (constantA && constantB)
    {
        M = constantM;
        N = constantN;
    }
    else if (constantA)
    {
        const Mat& B = bottom_blobs[0];
        M = constantM;
        N = transB ? (B.dims == 3 ? B.c : B.h) * B.elempack : B.w;
    }
    else if (constantB)
    {
        const Mat& A = bottom_blobs[0];
        M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;
        N = constantN;
    }
    else
    {
        const Mat& A = bottom_blobs[0];
        const Mat& B = bottom_blobs[1];
        M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;
        N = transB ? (B.dims == 3 ? B.c : B.h) * B.elempack : B.w;
    }

    Mat C;
    int broadcast_type_C = 0;
    if (constantC)
    {
        C = CT_data;
        broadcast_type_C = constant_broadcast_type_C;
    }
    else
    {
        if (constantA && constantB)
        {
            C = bottom_blobs.size() == 1 ? bottom_blobs[0] : Mat();
        }
        else if (constantA)
        {
            C = bottom_blobs.size() == 2 ? bottom_blobs[1] : Mat();
        }
        else if (constantB)
        {
            C = bottom_blobs.size() == 2 ? bottom_blobs[1] : Mat();
        }
        else
        {
            C = bottom_blobs.size() == 3 ? bottom_blobs[2] : Mat();
        }

        if (!C.empty())
        {
            if (C.dims == 1 && C.w == 1)
            {
                // scalar
                broadcast_type_C = 0;
            }
            if (C.dims == 1 && C.w * C.elempack == M)
            {
                // M
                // auto broadcast from h to w is the ncnn-style convention
                broadcast_type_C = 1;
            }
            if (C.dims == 1 && C.w * C.elempack == N)
            {
                // N
                broadcast_type_C = 4;
            }
            if (C.dims == 2 && C.w == 1 && C.h * C.elempack == M)
            {
                // Mx1
                broadcast_type_C = 2;
            }
            if (C.dims == 2 && C.w == N && C.h * C.elempack == M)
            {
                // MxN
                broadcast_type_C = 3;
            }
            if (C.dims == 2 && C.w == N && C.h * C.elempack == 1)
            {
                // 1xN
                broadcast_type_C = 4;
            }
        }
    }

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        int outh = output_transpose ? N : M;
#if __AVX512F__
        out_elempack = outh % 16 == 0 ? 16 : outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#else
        out_elempack = outh % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // FIXME use output_elempack
    // int output_elempack = out_elempack > 4 ? 4 : out_elempack;

    if (output_elempack)
        out_elempack = output_elempack;
    size_t out_elemsize = 4u * out_elempack;

    // FIXME use output_elemtype instead of input_elemtype
    // int output_elemtype = input_elemtype;

    // TODO use output_elemtype

    Mat& top_blob = top_blobs[0];
    if (output_transpose)
    {
        if (output_N1M)
            top_blob.create(M, 1, N / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        else
            top_blob.create(M, N / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    else
    {
        if (output_N1M)
            top_blob.create(N, 1, M / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        else
            top_blob.create(N, M / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int _nT = nT ? nT : opt.num_threads;
    if (nT != 0 && opt.num_threads != nT)
    {
        // force num_threads the same as in create_pipeline
        // so we could use pre-packed A/B from the same tile config
        NCNN_LOGE("opt.num_threads %d changed, gemm will use load-time value %d", opt.num_threads, nT);
    }

    int ret = 0;
    if (constantA && constantB)
    {
        ret = gemm_AT_BT_x86_int8(AT_data, A_data_int8_scales, BT_data, B_data_int8_scale, C, top_blob, broadcast_type_C, constantM, constantN, constantK, output_transpose, alpha, beta, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else if (constantA)
    {
        const Mat& B = bottom_blobs[0];
        ret = gemm_AT_x86_int8(AT_data, A_data_int8_scales, B, C, top_blob, broadcast_type_C, constantM, constantK, transB, output_transpose, alpha, beta, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else if (constantB)
    {
        const Mat& A = bottom_blobs[0];
        ret = gemm_BT_x86_int8(A, BT_data, B_data_int8_scale, C, top_blob, broadcast_type_C, constantN, constantK, transA, output_transpose, alpha, beta, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else
    {
        const Mat& A = bottom_blobs[0];
        const Mat& B = bottom_blobs[1];
        ret = gemm_x86_int8(A, B, C, top_blob, broadcast_type_C, transA, transB, output_transpose, alpha, beta, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }

    return ret;
}